

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.h
# Opt level: O2

void ehooks_post_reentrancy(tsdn_t *tsdn)

{
  int8_t *piVar1;
  
  if (tsdn == (tsdn_t *)0x0) {
    tsdn = (tsdn_t *)__tls_get_addr(&PTR_027eeb58);
    if ((((tsd_t *)tsdn)->state).repr != '\0') {
      tsdn = (tsdn_t *)duckdb_je_tsd_fetch_slow((tsd_t *)tsdn,false);
    }
  }
  piVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != '\0') {
    return;
  }
  duckdb_je_tsd_slow_update(&tsdn->tsd);
  return;
}

Assistant:

static inline void
ehooks_post_reentrancy(tsdn_t *tsdn) {
	tsd_t *tsd = tsdn_null(tsdn) ? tsd_fetch() : tsdn_tsd(tsdn);
	tsd_post_reentrancy_raw(tsd);
}